

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int makemask(char *smask,int count)

{
  char *pcVar1;
  uint local_18;
  int mask;
  int count_local;
  char *smask_local;
  
  pcVar1 = strchr(smask,99);
  local_18 = (uint)(pcVar1 != (char *)0x0);
  pcVar1 = strchr(smask,0x72);
  if (pcVar1 != (char *)0x0) {
    local_18 = local_18 | 2;
  }
  pcVar1 = strchr(smask,0x6c);
  if (pcVar1 != (char *)0x0) {
    local_18 = local_18 | 4;
  }
  if (0 < count) {
    local_18 = local_18 | 8;
  }
  return local_18;
}

Assistant:

static int makemask (const char *smask, int count) {
  int mask = 0;
  if (strchr(smask, 'c')) mask |= LUA_MASKCALL;
  if (strchr(smask, 'r')) mask |= LUA_MASKRET;
  if (strchr(smask, 'l')) mask |= LUA_MASKLINE;
  if (count > 0) mask |= LUA_MASKCOUNT;
  return mask;
}